

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

int32_t __thiscall icu_63::UCharsTrie::getNextUChars(UCharsTrie *this,Appendable *out)

{
  char16_t cVar1;
  char16_t *pcVar2;
  int32_t iVar3;
  uint uVar4;
  char16_t *pos;
  
  pcVar2 = this->pos_;
  iVar3 = 0;
  if (pcVar2 != (char16_t *)0x0) {
    if (this->remainingMatchLength_ < 0) {
      pos = pcVar2 + 1;
      cVar1 = *pcVar2;
      uVar4 = (uint)(ushort)cVar1;
      if (0x3f < (ushort)cVar1) {
        if (cVar1 < L'\0') {
          return 0;
        }
        if (0x403f < (ushort)cVar1) {
          if ((ushort)cVar1 < 0x7fc0) {
            pos = pcVar2 + 2;
          }
          else {
            pos = pcVar2 + 3;
          }
        }
        uVar4 = (ushort)cVar1 & 0x3f;
      }
      if (uVar4 < 0x30) {
        if (uVar4 == 0) {
          uVar4 = (uint)(ushort)*pos;
          pos = pos + 1;
        }
        uVar4 = uVar4 + 1;
        (*(out->super_UObject)._vptr_UObject[6])(out,(ulong)uVar4);
        getNextBranchUChars(pos,uVar4,out);
        return uVar4;
      }
      cVar1 = *pos;
    }
    else {
      cVar1 = *pcVar2;
    }
    (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)cVar1);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int32_t
UCharsTrie::getNextUChars(Appendable &out) const {
    const UChar *pos=pos_;
    if(pos==NULL) {
        return 0;
    }
    if(remainingMatchLength_>=0) {
        out.appendCodeUnit(*pos);  // Next unit of a pending linear-match node.
        return 1;
    }
    int32_t node=*pos++;
    if(node>=kMinValueLead) {
        if(node&kValueIsFinal) {
            return 0;
        } else {
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
    if(node<kMinLinearMatch) {
        if(node==0) {
            node=*pos++;
        }
        out.reserveAppendCapacity(++node);
        getNextBranchUChars(pos, node, out);
        return node;
    } else {
        // First unit of the linear-match node.
        out.appendCodeUnit(*pos);
        return 1;
    }
}